

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::FastEndGroupImpl<unsigned_char>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  TcParseTableBase *ctx_00;
  uchar uVar1;
  uint16_t uVar2;
  uint uVar3;
  char *pcVar4;
  ParseContext *pPVar5;
  uint *puVar6;
  TcFieldData local_a8 [2];
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_98;
  uint64_t local_90;
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData data_local;
  uint32_t has_bits_offset;
  
  local_90 = hasbits;
  hasbits_local = (uint64_t)table;
  table_local = (TcParseTableBase *)ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)msg;
  msg_local = (MessageLite *)data.field_0;
  uVar1 = TcFieldData::coded_tag<unsigned_char>((TcFieldData *)&msg_local);
  pcVar4 = ptr_local;
  pPVar5 = ctx_local;
  ctx_00 = table_local;
  if (uVar1 != '\0') {
    TcFieldData::TcFieldData((TcFieldData *)&local_98);
    pcVar4 = MiniParse((MessageLite *)pcVar4,(char *)pPVar5,(ParseContext *)ctx_00,
                       (TcFieldData)local_98,(TcParseTableBase *)hasbits_local,local_90);
    return pcVar4;
  }
  uVar2 = TcFieldData::decoded_tag((TcFieldData *)&msg_local);
  EpsCopyInputStream::SetLastTag((EpsCopyInputStream *)ctx_00,(uint)uVar2);
  pcVar4 = ptr_local;
  pPVar5 = (ParseContext *)((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 1);
  ctx_local = pPVar5;
  TcFieldData::TcFieldData(local_a8);
  if (*(ushort *)hasbits_local != 0) {
    uVar3 = (uint)local_90;
    puVar6 = RefAt<unsigned_int>(pcVar4,(ulong)(uint)*(ushort *)hasbits_local);
    *puVar6 = uVar3 | *puVar6;
  }
  return (char *)pPVar5;
}

Assistant:

const char* TcParser::FastEndGroupImpl(PROTOBUF_TC_PARAM_DECL) {
  if (ABSL_PREDICT_FALSE(data.coded_tag<TagType>() != 0)) {
    PROTOBUF_MUSTTAIL return MiniParse(PROTOBUF_TC_PARAM_NO_DATA_PASS);
  }
  ctx->SetLastTag(data.decoded_tag());
  ptr += sizeof(TagType);
  PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}